

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O1

void p2sc_init(char *prgname,char *appname,char *filename,char *runid)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *value;
  
  if (prgname != (char *)0x0) {
    if (shash != (GHashTable *)0x0) {
      lVar1 = g_hash_table_lookup(shash,"prgname");
      if (lVar1 != 0) goto LAB_001165ac;
    }
    p2sc_set_string("prgname",prgname);
  }
LAB_001165ac:
  if (appname != (char *)0x0) {
    if (shash != (GHashTable *)0x0) {
      lVar1 = g_hash_table_lookup(shash,"appname");
      if (lVar1 != 0) goto LAB_001165dd;
    }
    p2sc_set_string("appname",appname);
  }
LAB_001165dd:
  if (runid != (char *)0x0) {
    if (shash != (GHashTable *)0x0) {
      lVar1 = g_hash_table_lookup(shash,"runid");
      if (lVar1 != 0) goto LAB_0011660e;
    }
    p2sc_set_string("runid",runid);
  }
LAB_0011660e:
  if (filename != (char *)0x0) {
    p2sc_set_string("filename",filename);
  }
  if (shash == (GHashTable *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = g_hash_table_lookup(shash,"appname");
  }
  if (shash == (GHashTable *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = g_hash_table_lookup(shash,"runid");
  }
  value = (char *)g_strdup_printf("%s %s",uVar2,uVar3);
  p2sc_set_string("history",value);
  g_free(value);
  return;
}

Assistant:

void p2sc_init(const char *prgname, const char *appname, const char *filename, const char *runid) {
    /* change of prg/appname/runid not allowed */
    if (prgname && !p2sc_get_string("prgname"))
        p2sc_set_string("prgname", prgname);
    if (appname && !p2sc_get_string("appname"))
        p2sc_set_string("appname", appname);
    if (runid && !p2sc_get_string("runid"))
        p2sc_set_string("runid", runid);
    /* allow change of filename, but avoid NULL */
    if (filename)
        p2sc_set_string("filename", filename);

    char *hist = g_strdup_printf("%s %s", p2sc_get_string("appname"), p2sc_get_string("runid"));
    p2sc_set_string("history", hist);
    g_free(hist);
}